

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::~Node
          (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this)

{
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this_local;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_00292bf0;
  std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::~vector(&this->children);
  TestCaseStats::~TestCaseStats(&this->value);
  return;
}

Assistant:

virtual ~Node() {}